

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O3

Reg arm::make_register(RegisterKind k,uint32_t num)

{
  switch(k) {
  case DoubleVector:
    return num + 0x10;
  case QuadVector:
    return num + 0x30;
  case VirtualGeneralPurpose:
    return num + 0x40;
  case VirtualDoubleVector:
    return num + 0x80000000;
  case VirtualQuadVector:
    num = num + 0xc0000000;
  }
  return num;
}

Assistant:

Reg make_register(RegisterKind k, uint32_t num) {
  switch (k) {
    case RegisterKind::GeneralPurpose:
      return num + REG_GP_START;
    case RegisterKind::DoubleVector:
      return num + REG_DOUBLE_START;
    case RegisterKind::QuadVector:
      return num + REG_QUAD_START;
    case RegisterKind::VirtualGeneralPurpose:
      return num + REG_V_GP_START;
    case RegisterKind::VirtualDoubleVector:
      return num + REG_V_DOUBLE_START;
    case RegisterKind::VirtualQuadVector:
      return num + REG_V_QUAD_START;
    default:
      return num;
  }
}